

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceBlock
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  bool bVar3;
  long *local_48 [2];
  long local_38 [2];
  
  bVar2 = ConsumeEndOfDeclaration(this,"{",service_location);
  if (bVar2) {
    bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    bVar3 = true;
    while (!bVar2) {
      if ((this->input_->current_).type == TYPE_END) {
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"Reached end of input in service definition (missing \'}\').",
                   "");
        pEVar1 = this->error_collector_;
        if (pEVar1 != (ErrorCollector *)0x0) {
          (*pEVar1->_vptr_ErrorCollector[2])
                    (pEVar1,(ulong)(uint)(this->input_->current_).line,
                     (ulong)(uint)(this->input_->current_).column,local_48);
        }
        this->had_errors_ = true;
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
        goto LAB_001c67f5;
      }
      bVar2 = ParseServiceStatement(this,service,service_location);
      if (!bVar2) {
        SkipStatement(this);
      }
      bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    }
  }
  else {
LAB_001c67f5:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Parser::ParseServiceBlock(ServiceDescriptorProto* service,
                               const LocationRecorder& service_location) {
  DO(ConsumeEndOfDeclaration("{", &service_location));

  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in service definition (missing '}').");
      return false;
    }

    if (!ParseServiceStatement(service, service_location)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  return true;
}